

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall
kj::BufferedOutputStreamWrapper::write
          (BufferedOutputStreamWrapper *this,int __fd,void *__buf,size_t __n)

{
  byte *__dest;
  uchar *puVar1;
  void *pvVar2;
  int iVar3;
  void *in_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  byte *__src;
  size_t __n_00;
  void *__n_01;
  
  __src = (byte *)CONCAT44(in_register_00000034,__fd);
  __dest = this->bufferPos;
  if (__dest == __src) {
    this->bufferPos = __dest + (long)__buf;
  }
  else {
    puVar1 = (this->buffer).ptr;
    pvVar2 = (void *)(this->buffer).size_;
    __n_01 = (void *)((long)pvVar2 + ((long)puVar1 - (long)__dest));
    __n_00 = (long)__buf - (long)__n_01;
    if (__buf < __n_01 || __n_00 == 0) {
      in_RAX = memcpy(__dest,__src,(size_t)__buf);
      this->bufferPos = this->bufferPos + (long)__buf;
    }
    else {
      if (pvVar2 < __buf) {
        (*this->inner->_vptr_OutputStream[2])(this->inner,puVar1,(long)__dest - (long)puVar1);
        this->bufferPos = (this->buffer).ptr;
        iVar3 = (*this->inner->_vptr_OutputStream[2])(this->inner,__src,__buf);
        return CONCAT44(extraout_var,iVar3);
      }
      memcpy(__dest,__src,(size_t)__n_01);
      (*this->inner->_vptr_OutputStream[2])(this->inner,(this->buffer).ptr,(this->buffer).size_);
      in_RAX = memcpy((this->buffer).ptr,__src + (long)__n_01,__n_00);
      this->bufferPos = (this->buffer).ptr + __n_00;
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void BufferedOutputStreamWrapper::write(const void* src, size_t size) {
  if (src == bufferPos) {
    // Oh goody, the caller wrote directly into our buffer.
    bufferPos += size;
  } else {
    size_t available = buffer.end() - bufferPos;

    if (size <= available) {
      memcpy(bufferPos, src, size);
      bufferPos += size;
    } else if (size <= buffer.size()) {
      // Too much for this buffer, but not a full buffer's worth, so we'll go ahead and copy.
      memcpy(bufferPos, src, available);
      inner.write(buffer.begin(), buffer.size());

      size -= available;
      src = reinterpret_cast<const byte*>(src) + available;

      memcpy(buffer.begin(), src, size);
      bufferPos = buffer.begin() + size;
    } else {
      // Writing so much data that we might as well write directly to avoid a copy.
      inner.write(buffer.begin(), bufferPos - buffer.begin());
      bufferPos = buffer.begin();
      inner.write(src, size);
    }
  }
}